

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

bool __thiscall absl::Mutex::LockWhenWithDeadline(Mutex *this,Condition *cond,Time deadline)

{
  bool bVar1;
  GraphId id;
  KernelTimeout t;
  Time t_00;
  
  id = DebugOnlyDeadlockCheck(this);
  t_00.rep_._12_4_ = 0;
  t_00.rep_.rep_hi_ = SUB128(deadline.rep_._0_12_,0);
  t_00.rep_.rep_lo_ = SUB124(deadline.rep_._0_12_,8);
  t.ns_ = synchronization_internal::KernelTimeout::MakeNs(t_00);
  bVar1 = LockSlowWithDeadline(this,(MuHow)kExclusiveS,cond,t,0);
  DebugOnlyLockEnter(this,id);
  return bVar1;
}

Assistant:

bool Mutex::LockWhenWithDeadline(const Condition &cond, absl::Time deadline) {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, 0);
  GraphId id = DebugOnlyDeadlockCheck(this);
  bool res = LockSlowWithDeadline(kExclusive, &cond,
                                  KernelTimeout(deadline), 0);
  DebugOnlyLockEnter(this, id);
  ABSL_TSAN_MUTEX_POST_LOCK(this, 0, 0);
  return res;
}